

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O2

void printModel(ModelPtr *model,bool includeMaths)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  ComponentPtr component;
  ComponentPtr local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"MODEL: \'");
  libcellml::NamedEntity::name_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  std::operator<<(poVar2,"\'");
  std::__cxx11::string::~string((string *)&local_50);
  libcellml::Entity::id_abi_cxx11_();
  bVar1 = std::operator!=(&local_50,"");
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,", id: \'");
    libcellml::Entity::id_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    std::operator<<(poVar2,"\'");
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&FIXED_INDENT_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"UNITS: ");
  libcellml::Model::unitsCount();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," custom units");
  std::endl<char,std::char_traits<char>>(poVar2);
  uVar4 = 0;
  while( true ) {
    uVar3 = libcellml::Model::unitsCount();
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&FIXED_INDENT_abi_cxx11_);
    if (uVar3 <= uVar4) break;
    poVar2 = std::operator<<(poVar2,(string *)&FIXED_INDENT_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"[");
    uVar4 = uVar4 + 1;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"]: ");
    libcellml::Model::units((ulong)&local_60);
    libcellml::NamedEntity::name_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  poVar2 = std::operator<<(poVar2,"COMPONENTS: ");
  libcellml::ComponentEntity::componentCount();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," components");
  std::endl<char,std::char_traits<char>>(poVar2);
  uVar4 = 0;
  while( true ) {
    uVar3 = libcellml::ComponentEntity::componentCount();
    if (uVar3 <= uVar4) break;
    libcellml::ComponentEntity::component((ulong)&local_60);
    std::operator+(&local_50,&FIXED_INDENT_abi_cxx11_,&FIXED_INDENT_abi_cxx11_);
    printComponent(&local_60,uVar4,&local_50,includeMaths);
    std::__cxx11::string::~string((string *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void printModel(const libcellml::ModelPtr &model, bool includeMaths)
{
    std::cout << "MODEL: '" << model->name() << "'";
    if (model->id() != "") {
        std::cout << ", id: '" << model->id() << "'";
    }
    std::cout << std::endl;

    std::cout << FIXED_INDENT << "UNITS: " << model->unitsCount() << " custom units" << std::endl;
    for (size_t u = 0; u < model->unitsCount(); ++u) {
        std::cout << FIXED_INDENT << FIXED_INDENT << "[" << u + 1 << "]: " << model->units(u)->name() << std::endl;
    }

    std::cout << FIXED_INDENT << "COMPONENTS: " << model->componentCount() << " components" << std::endl;
    for (size_t c = 0; c < model->componentCount(); ++c) {
        auto component = model->component(c);
        printComponent(component, c, FIXED_INDENT + FIXED_INDENT, includeMaths);
    }
}